

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void log_sub_block_var(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs,double *var_min,double *var_max)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  aom_variance_fn_t vf;
  int iVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  int j;
  long lVar8;
  int i;
  int iVar9;
  double dVar10;
  double local_58;
  double local_50;
  
  uVar3 = ((x->e_mbd).cur_buf)->flags;
  iVar4 = (x->e_mbd).mb_to_right_edge;
  iVar5 = (x->e_mbd).mb_to_bottom_edge;
  uVar7 = CONCAT71(in_register_00000011,bs) & 0xffffffff;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar7];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar7];
  vf = cpi->ppi->fn_ptr[0].vf;
  local_58 = 2147483647.0;
  local_50 = 0.0;
  for (iVar9 = 0; iVar9 < (int)((uint)bVar2 * 4 - (iVar5 >> 0x1f & (uint)-iVar5 >> 3));
      iVar9 = iVar9 + 4) {
    for (lVar8 = 0; lVar8 < (long)((ulong)bVar1 * 4 - (ulong)(iVar4 >> 0x1f & (uint)-iVar4 >> 3));
        lVar8 = lVar8 + 4) {
      iVar6 = x->plane[0].src.stride;
      iVar6 = av1_calc_normalized_variance
                        (vf,x->plane[0].src.buf + lVar8 + iVar9 * iVar6,iVar6,uVar3 >> 3 & 1);
      dVar10 = (double)iVar6;
      if (dVar10 <= local_58) {
        local_58 = dVar10;
      }
      if (local_50 <= dVar10) {
        local_50 = dVar10;
      }
    }
  }
  dVar10 = log1p(local_58 * 0.0625);
  *var_min = dVar10;
  dVar10 = log1p(local_50 * 0.0625);
  *var_max = dVar10;
  return;
}

Assistant:

static void log_sub_block_var(const AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bs,
                              double *var_min, double *var_max) {
  // This functions returns a the minimum and maximum log variances for 4x4
  // sub blocks in the current block.

  const MACROBLOCKD *const xd = &x->e_mbd;
  const int is_hbd = is_cur_buf_hbd(xd);
  const int right_overflow =
      (xd->mb_to_right_edge < 0) ? ((-xd->mb_to_right_edge) >> 3) : 0;
  const int bottom_overflow =
      (xd->mb_to_bottom_edge < 0) ? ((-xd->mb_to_bottom_edge) >> 3) : 0;
  const int bw = MI_SIZE * mi_size_wide[bs] - right_overflow;
  const int bh = MI_SIZE * mi_size_high[bs] - bottom_overflow;

  // Initialize minimum variance to a large value and maximum variance to 0.
  double min_var_4x4 = (double)INT_MAX;
  double max_var_4x4 = 0.0;

  aom_variance_fn_t vf = cpi->ppi->fn_ptr[BLOCK_4X4].vf;
  for (int i = 0; i < bh; i += MI_SIZE) {
    for (int j = 0; j < bw; j += MI_SIZE) {
      int var;
      // Calculate the 4x4 sub-block variance.
      var = av1_calc_normalized_variance(
          vf, x->plane[0].src.buf + (i * x->plane[0].src.stride) + j,
          x->plane[0].src.stride, is_hbd);

      // Record min and max for over-arching block
      min_var_4x4 = AOMMIN(min_var_4x4, var);
      max_var_4x4 = AOMMAX(max_var_4x4, var);
    }
  }
  *var_min = log1p(min_var_4x4 / 16.0);
  *var_max = log1p(max_var_4x4 / 16.0);
}